

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplateUTest.hpp
# Opt level: O1

void Qentem::Test::TestMathUTag1(QTest *test)

{
  QNumber64 QVar1;
  char16_t *pcVar2;
  Value<char16_t> *pVVar3;
  Array<Qentem::Tags::TagBit> tags_cache;
  StringStream<char16_t> ss;
  Value<char16_t> value;
  QNumber64 local_98;
  ulong uStack_90;
  StringStream<char16_t> local_88;
  anon_union_16_5_5c8fea6c_for_Value<char16_t>_1 local_78;
  char local_68;
  anon_union_16_5_5c8fea6c_for_Value<char16_t>_1 local_58;
  undefined8 local_48;
  char16_t *local_40;
  undefined4 local_38;
  
  local_88.storage_ = (char16_t *)0x0;
  local_88.length_ = 0;
  local_88.capacity_ = 0;
  local_78.array_.storage_ = (Value<char16_t> *)0x0;
  local_78._8_8_ = 0;
  local_68 = 0;
  Value<char16_t>::reset((Value<char16_t> *)&local_78.array_);
  local_68 = '\x02';
  pVVar3 = HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::Get
                     ((HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)&local_78.array_
                      ,L"a1",2);
  Value<char16_t>::reset(pVVar3);
  (pVVar3->field_0).array_.storage_ = (Value<char16_t> *)0x5;
  pVVar3->type_ = IntLong;
  if (local_68 != '\x02') {
    Value<char16_t>::reset((Value<char16_t> *)&local_78.array_);
    local_68 = '\x02';
  }
  pVVar3 = HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::Get
                     ((HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)&local_78.array_
                      ,L"a2",2);
  Value<char16_t>::reset(pVVar3);
  pVVar3->type_ = True;
  if (local_68 != '\x02') {
    Value<char16_t>::reset((Value<char16_t> *)&local_78.array_);
    local_68 = '\x02';
  }
  pVVar3 = HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::Get
                     ((HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)&local_78.array_
                      ,L"a3",2);
  Value<char16_t>::reset(pVVar3);
  pVVar3->type_ = Null;
  if (local_68 != '\x02') {
    Value<char16_t>::reset((Value<char16_t> *)&local_78.array_);
    local_68 = '\x02';
  }
  pVVar3 = HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::Get
                     ((HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)&local_78.array_
                      ,L"a4",2);
  Value<char16_t>::reset(pVVar3);
  pVVar3->type_ = False;
  if (local_68 != '\x02') {
    Value<char16_t>::reset((Value<char16_t> *)&local_78.array_);
    local_68 = '\x02';
  }
  pVVar3 = HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::Get
                     ((HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)&local_78.array_
                      ,L"a5",2);
  Value<char16_t>::operator=(pVVar3,L"10");
  if (local_68 != '\x02') {
    Value<char16_t>::reset((Value<char16_t> *)&local_78.array_);
    local_68 = '\x02';
  }
  pVVar3 = HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::Get
                     ((HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)&local_78.array_
                      ,L"a6",2);
  Value<char16_t>::operator=(pVVar3,L"20");
  if (local_68 != '\x02') {
    Value<char16_t>::reset((Value<char16_t> *)&local_78.array_);
    local_68 = '\x02';
  }
  pVVar3 = HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::Get
                     ((HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)&local_78.array_
                      ,L"a7",2);
  Value<char16_t>::reset(pVVar3);
  (pVVar3->field_0).array_.storage_ = (Value<char16_t> *)0x6;
  pVVar3->type_ = IntLong;
  if (local_68 != '\x02') {
    Value<char16_t>::reset((Value<char16_t> *)&local_78.array_);
    local_68 = '\x02';
  }
  pVVar3 = HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::Get
                     ((HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)&local_78.array_
                      ,L"a8",2);
  Value<char16_t>::reset(pVVar3);
  (pVVar3->field_0).array_.storage_ = (Value<char16_t> *)0x1;
  pVVar3->type_ = IntLong;
  if (local_68 != '\x02') {
    Value<char16_t>::reset((Value<char16_t> *)&local_78.array_);
    local_68 = '\x02';
  }
  pVVar3 = HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::Get
                     ((HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)&local_78.array_
                      ,L"a9",2);
  Value<char16_t>::operator=(pVVar3,L"1");
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:1+1}";
  local_38 = 10;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:1+1}",10,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x1460c4,0x6f9);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:a1}+8}";
  local_38 = 0x11;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:a1}+8}",0x11,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,&local_88,(char16_t (*) [3])L"13",0x6fc);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:a7}+8}";
  local_38 = 0x11;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:a7}+8}",0x11,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,&local_88,(char16_t (*) [3])L"14",0x6ff);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:a7}+{var:a1}}";
  local_38 = 0x18;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:a7}+{var:a1}}",0x18,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,&local_88,(char16_t (*) [3])0x13c69a,0x702);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:a5}+{var:a1}}";
  local_38 = 0x18;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:a5}+{var:a1}}",0x18,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,&local_88,(char16_t (*) [3])L"15",0x705);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:a1}+{var:a5}}";
  local_38 = 0x18;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:a1}+{var:a5}}",0x18,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,&local_88,(char16_t (*) [3])L"15",0x708);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:a6}+{var:a5}}";
  local_38 = 0x18;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:a6}+{var:a5}}",0x18,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,&local_88,(char16_t (*) [3])0x1418c4,0x70b);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:a6}*{var:a2}}";
  local_38 = 0x18;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:a6}*{var:a2}}",0x18,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,&local_88,(char16_t (*) [3])0x13c2a0,0x70e);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:a6}*{var:a4}}";
  local_38 = 0x18;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:a6}*{var:a4}}",0x18,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13ea42,0x711);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:a6}*{var:a7}}";
  local_38 = 0x18;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:a6}*{var:a7}}",0x18,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,&local_88,(char16_t (*) [4])L"120",0x714);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:a7}+{var:a6}}";
  local_38 = 0x18;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:a7}+{var:a6}}",0x18,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,&local_88,(char16_t (*) [3])L"26",0x717);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:a1}+{var:a2}}";
  local_38 = 0x18;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:a1}+{var:a2}}",0x18,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13c2da,0x71a);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:a8}=={var:a2}}";
  local_38 = 0x19;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:a8}=={var:a2}}",0x19,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13eadc,0x71d);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:a2}=={var:a8}}";
  local_38 = 0x19;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:a2}=={var:a8}}",0x19,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13eadc,0x720);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:a5}!={var:a1}}";
  local_38 = 0x19;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:a5}!={var:a1}}",0x19,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13eadc,0x723);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:a2}!={var:a4}}";
  local_38 = 0x19;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:a2}!={var:a4}}",0x19,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13eadc,0x726);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:a2}==true}";
  local_38 = 0x15;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:a2}==true}",0x15,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13eadc,0x729);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:a9}=={var:a8}}";
  local_38 = 0x19;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:a9}=={var:a8}}",0x19,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13eadc,0x72c);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:a8}=={var:a9}}";
  local_38 = 0x19;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:a8}=={var:a9}}",0x19,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13eadc,0x72f);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:1=={var:a8}}";
  local_38 = 0x12;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:1=={var:a8}}",0x12,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13eadc,0x732);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:6-5==({var:a9})}";
  local_38 = 0x16;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:6-5==({var:a9})}",0x16,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13eadc,0x735);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:6-5==({var:a8})}";
  local_38 = 0x16;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:6-5==({var:a8})}",0x16,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13eadc,0x738);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:null!={var:a3}}";
  local_38 = 0x15;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:null!={var:a3}}",0x15,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13ea42,0x73b);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:({var:a3})==(0)}";
  local_38 = 0x16;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:({var:a3})==(0)}",0x16,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13eadc,0x73e);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:a1}+{var:a7}}";
  local_38 = 0x18;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:a1}+{var:a7}}",0x18,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,&local_88,(char16_t (*) [3])0x13c69a,0x741);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:a1}+{var:a7}}{math:{var:a1}+{var:a7}}";
  local_38 = 0x30;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:a1}+{var:a7}}{math:{var:a1}+{var:a7}}",0x30,
             (Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[5]>
            (test,&local_88,(char16_t (*) [5])L"1111",0x745);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:a1}+{var:a7}}*{math:{var:a1}+{var:a7}}";
  local_38 = 0x31;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:a1}+{var:a7}}*{math:{var:a1}+{var:a7}}",0x31,
             (Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,&local_88,(char16_t (*) [6])L"11*11",0x749);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:a1}+{var:a7}}##{math:{var:a1}+{var:a7}}";
  local_38 = 0x32;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:a1}+{var:a7}}##{math:{var:a1}+{var:a7}}",0x32,
             (Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (test,&local_88,(char16_t (*) [7])L"11##11",0x74d);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:a1}+{var:a7}}&&&%%^^&&*{math:{var:a1}+{var:a7}}";
  local_38 = 0x3a;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:a1}+{var:a7}}&&&%%^^&&*{math:{var:a1}+{var:a7}}",0x3a,
             (Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[15]>
            (test,&local_88,(char16_t (*) [15])L"11&&&%%^^&&*11",0x751);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math: {var:a1}+8}";
  local_38 = 0x12;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math: {var:a1}+8}",0x12,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,&local_88,(char16_t (*) [3])L"13",0x756);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:  {var:a7}+8}";
  local_38 = 0x13;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:  {var:a7}+8}",0x13,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,&local_88,(char16_t (*) [3])L"14",0x759);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:     {var:a7}+{var:a1}}";
  local_38 = 0x1d;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:     {var:a7}+{var:a1}}",0x1d,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,&local_88,(char16_t (*) [3])0x13c69a,0x75c);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:a5} +{var:a1}}";
  local_38 = 0x19;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:a5} +{var:a1}}",0x19,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,&local_88,(char16_t (*) [3])L"15",0x75f);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:a1}  +{var:a5}}";
  local_38 = 0x1a;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:a1}  +{var:a5}}",0x1a,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,&local_88,(char16_t (*) [3])L"15",0x762);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:a6}    +{var:a5}}";
  local_38 = 0x1c;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:a6}    +{var:a5}}",0x1c,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,&local_88,(char16_t (*) [3])0x1418c4,0x765);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:a6}* {var:a2}}";
  local_38 = 0x19;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:a6}* {var:a2}}",0x19,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,&local_88,(char16_t (*) [3])0x13c2a0,0x768);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:a6}*  {var:a4}}";
  local_38 = 0x1a;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:a6}*  {var:a4}}",0x1a,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13ea42,0x76b);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:a6}*      {var:a7}}";
  local_38 = 0x1e;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:a6}*      {var:a7}}",0x1e,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,&local_88,(char16_t (*) [4])L"120",0x76e);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:a7}+{var:a6} }";
  local_38 = 0x19;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:a7}+{var:a6} }",0x19,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,&local_88,(char16_t (*) [3])L"26",0x771);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:a1}+{var:a2}  }";
  local_38 = 0x1a;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:a1}+{var:a2}  }",0x1a,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13c2da,0x774);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:a8}=={var:a2}      }";
  local_38 = 0x1f;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:a8}=={var:a2}      }",0x1f,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13eadc,0x777);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:a2}=={var:a8}}";
  local_38 = 0x19;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:a2}=={var:a8}}",0x19,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13eadc,0x77a);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math: {var:a5}!={var:a1} }";
  local_38 = 0x1b;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math: {var:a5}!={var:a1} }",0x1b,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13eadc,0x77d);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:  {var:a2}!={var:a4}  }";
  local_38 = 0x1d;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:  {var:a2}!={var:a4}  }",0x1d,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13eadc,0x780);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:    1=={var:a9}     }";
  local_38 = 0x1b;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:    1=={var:a9}     }",0x1b,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13eadc,0x783);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:a9} == {var:a8}}";
  local_38 = 0x1b;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:a9} == {var:a8}}",0x1b,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13eadc,0x786);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:a8}  ==  {var:a9}}";
  local_38 = 0x1d;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:a8}  ==  {var:a9}}",0x1d,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13eadc,0x789);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:1==          {var:a8}}";
  local_38 = 0x1c;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:1==          {var:a8}}",0x1c,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13eadc,0x78c);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:6-5         ==1}";
  local_38 = 0x16;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:6-5         ==1}",0x16,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13eadc,0x78f);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:1          ==            {var:a8}}";
  local_38 = 0x28;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:1          ==            {var:a8}}",0x28,
             (Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13eadc,0x792);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:     0     !=    ({var:a3})        }";
  local_38 = 0x2a;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:     0     !=    ({var:a3})        }",0x2a,
             (Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13ea42,0x795);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:a3}       ==       null     }";
  local_38 = 0x28;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:a3}       ==       null     }",0x28,
             (Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13eadc,0x798);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:((8+1+{var:a8}))}";
  local_38 = 0x17;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:((8+1+{var:a8}))}",0x17,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,&local_88,(char16_t (*) [3])0x13d994,0x79b);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:10==(8+1+{var:a8})}";
  local_38 = 0x19;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:10==(8+1+{var:a8})}",0x19,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13eadc,0x79e);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:((8+1+{var:a8}))==9+1}";
  local_38 = 0x1c;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:((8+1+{var:a8}))==9+1}",0x1c,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13eadc,0x7a1);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:(5*2)==((8+1+{var:a8}))}";
  local_38 = 0x1e;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:(5*2)==((8+1+{var:a8}))}",0x1e,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13eadc,0x7a4);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  Value<char16_t>::reset((Value<char16_t> *)&local_78.array_);
  local_68 = 0;
  Value<char16_t>::reset((Value<char16_t> *)&local_78.array_);
  local_68 = '\x03';
  local_58.number_ = (QNumber64)0x5;
  local_48 = CONCAT71(local_48._1_7_,6);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_78.array_,(Value<char16_t> *)&local_58.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_58.array_);
  if (local_68 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_78.array_);
    local_68 = '\x03';
  }
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = CONCAT71(local_48._1_7_,8);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_78.array_,(Value<char16_t> *)&local_58.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_58.array_);
  if (local_68 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_78.array_);
    local_68 = '\x03';
  }
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = CONCAT71(local_48._1_7_,10);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_78.array_,(Value<char16_t> *)&local_58.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_58.array_);
  if (local_68 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_78.array_);
    local_68 = '\x03';
  }
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = CONCAT71(local_48._1_7_,9);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_78.array_,(Value<char16_t> *)&local_58.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_58.array_);
  String<char16_t>::String((String<char16_t> *)&local_98,L"10");
  if (local_68 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_78.array_);
    local_68 = '\x03';
  }
  local_58.array_.storage_ = (Value<char16_t> *)local_98;
  local_58.array_.index_ = (undefined4)uStack_90;
  uStack_90 = uStack_90 & 0xffffffff00000000;
  local_98.Natural = 0;
  local_48 = CONCAT71(local_48._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_78.array_,(Value<char16_t> *)&local_58.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_58.array_);
  QVar1 = local_98;
  if ((void *)local_98.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_98);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_98,L"20");
  if (local_68 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_78.array_);
    local_68 = '\x03';
  }
  local_58.number_.Natural = local_98;
  local_58.array_.index_ = (undefined4)uStack_90;
  uStack_90 = uStack_90 & 0xffffffff00000000;
  local_98.Natural = 0;
  local_48 = CONCAT71(local_48._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_78.array_,(Value<char16_t> *)&local_58.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_58.array_);
  QVar1 = local_98;
  if ((void *)local_98.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_98);
  }
  operator_delete((void *)QVar1);
  if (local_68 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_78.array_);
    local_68 = '\x03';
  }
  local_58.number_ = (QNumber64)0x6;
  local_48 = CONCAT71(local_48._1_7_,6);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_78.array_,(Value<char16_t> *)&local_58.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_58.array_);
  if (local_68 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_78.array_);
    local_68 = '\x03';
  }
  local_58.number_ = (QNumber64)0x1;
  local_48 = CONCAT71(local_48._1_7_,6);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_78.array_,(Value<char16_t> *)&local_58.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_58.array_);
  String<char16_t>::String((String<char16_t> *)&local_98,L"1");
  if (local_68 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_78.array_);
    local_68 = '\x03';
  }
  local_58.array_.storage_ = (Value<char16_t> *)local_98;
  local_58.array_.index_ = (undefined4)uStack_90;
  uStack_90 = uStack_90 & 0xffffffff00000000;
  local_98.Natural = 0;
  local_48 = CONCAT71(local_48._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_78.array_,(Value<char16_t> *)&local_58.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_58.array_);
  QVar1 = local_98;
  if ((void *)local_98.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_98);
  }
  operator_delete((void *)QVar1);
  String<char16_t>::String((String<char16_t> *)&local_98,L"Qentem");
  if (local_68 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_78.array_);
    local_68 = '\x03';
  }
  local_58.number_.Natural = local_98;
  local_58.array_.index_ = (undefined4)uStack_90;
  uStack_90 = uStack_90 & 0xffffffff00000000;
  local_98.Natural = 0;
  local_48 = CONCAT71(local_48._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_78.array_,(Value<char16_t> *)&local_58.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_58.array_);
  QVar1 = local_98;
  if ((void *)local_98.Natural != (void *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_98);
  }
  operator_delete((void *)QVar1);
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:0}+8}";
  local_38 = 0x10;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:0}+8}",0x10,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,&local_88,(char16_t (*) [3])L"13",0x7b5);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:6}+8}";
  local_38 = 0x10;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:6}+8}",0x10,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,&local_88,(char16_t (*) [3])L"14",0x7b8);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:6}+{var:0}}";
  local_38 = 0x16;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:6}+{var:0}}",0x16,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,&local_88,(char16_t (*) [3])0x13c69a,0x7bb);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:4}+{var:0}}";
  local_38 = 0x16;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:4}+{var:0}}",0x16,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,&local_88,(char16_t (*) [3])L"15",0x7be);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:0}+{var:4}}";
  local_38 = 0x16;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:0}+{var:4}}",0x16,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,&local_88,(char16_t (*) [3])L"15",0x7c1);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:5}+{var:4}}";
  local_38 = 0x16;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:5}+{var:4}}",0x16,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,&local_88,(char16_t (*) [3])0x1418c4,0x7c4);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:5}*{var:1}}";
  local_38 = 0x16;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:5}*{var:1}}",0x16,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,&local_88,(char16_t (*) [3])0x13c2a0,0x7c7);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:5}*{var:3}}";
  local_38 = 0x16;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:5}*{var:3}}",0x16,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13ea42,0x7ca);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:5}*{var:6}}";
  local_38 = 0x16;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:5}*{var:6}}",0x16,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,&local_88,(char16_t (*) [4])L"120",0x7cd);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:6}+{var:5}}";
  local_38 = 0x16;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:6}+{var:5}}",0x16,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,&local_88,(char16_t (*) [3])L"26",2000);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:0}+{var:1}}";
  local_38 = 0x16;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:0}+{var:1}}",0x16,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13c2da,0x7d3);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:7}=={var:1}}";
  local_38 = 0x17;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:7}=={var:1}}",0x17,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13eadc,0x7d6);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:1}=={var:7}}";
  local_38 = 0x17;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:1}=={var:7}}",0x17,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13eadc,0x7d9);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:4}!={var:0}}";
  local_38 = 0x17;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:4}!={var:0}}",0x17,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13eadc,0x7dc);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:1}!={var:3}}";
  local_38 = 0x17;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:1}!={var:3}}",0x17,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13eadc,0x7df);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:({var:1})==({var:8})}";
  local_38 = 0x1b;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:({var:1})==({var:8})}",0x1b,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13eadc,0x7e2);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"-{math:{var:8}=={var:7}}";
  local_38 = 0x18;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"-{math:{var:8}=={var:7}}",0x18,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,&local_88,(char16_t (*) [3])0x13d080,0x7e5);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"--{math:{var:7}=={var:8}}";
  local_38 = 0x19;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"--{math:{var:7}=={var:8}}",0x19,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,&local_88,(char16_t (*) [4])0x13d07e,0x7e8);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"---{math:1=={var:7}}";
  local_38 = 0x14;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"---{math:1=={var:7}}",0x14,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[5]>
            (test,&local_88,(char16_t (*) [5])L"---1",0x7eb);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:1==({var:8})}-";
  local_38 = 0x14;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:1==({var:8})}-",0x14,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (test,&local_88,(char16_t (*) [3])L"1-",0x7ee);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:6-5==({var:7})}--";
  local_38 = 0x17;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:6-5==({var:7})}--",0x17,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,&local_88,(char16_t (*) [4])L"1--",0x7f1);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:0==({var:2})}---";
  local_38 = 0x16;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:0==({var:2})}---",0x16,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[5]>
            (test,&local_88,(char16_t (*) [5])0x13d1d2,0x7f4);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"-{math:{var:2}!=null}-";
  local_38 = 0x16;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"-{math:{var:2}!=null}-",0x16,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (test,&local_88,(char16_t (*) [4])L"-0-",0x7f7);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"--{math:Qente=={var:9}}--";
  local_38 = 0x19;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"--{math:Qente=={var:9}}--",0x19,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (test,&local_88,(char16_t (*) [6])L"--0--",0x7fa);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"---{math:Qente !={var:9}}---";
  local_38 = 0x1c;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"---{math:Qente !={var:9}}---",0x1c,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,&local_88,(char16_t (*) [8])L"---1---",0x7fd);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:  Qentem   =={var:9}}";
  local_38 = 0x1b;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:  Qentem   =={var:9}}",0x1b,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13eadc,0x800);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:  Qentem!={var:9}}";
  local_38 = 0x18;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:  Qentem!={var:9}}",0x18,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13ea42,0x803);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:9}   ==    Qente}";
  local_38 = 0x1c;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:9}   ==    Qente}",0x1c,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13ea42,0x806);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:{var:9} !=    Qente    }";
  local_38 = 0x1e;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:{var:9} !=    Qente    }",0x1e,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13eadc,0x809);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math:  {var:9}   ==Qentem}";
  local_38 = 0x1b;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math:  {var:9}   ==Qentem}",0x1b,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13eadc,0x80c);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math: {var:9} !=Qentem}";
  local_38 = 0x18;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math: {var:9} !=Qentem}",0x18,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13ea42,0x80f);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math: true == {var:1}}";
  local_38 = 0x17;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math: true == {var:1}}",0x17,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13eadc,0x814);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math: {var:1} == true}";
  local_38 = 0x17;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math: {var:1} == true}",0x17,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13eadc,0x817);
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  local_98.Natural = 0;
  uStack_90 = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  local_48 = 0;
  local_40 = L"{math: 8 /2}";
  local_38 = 0xc;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{math: 8 /2}",0xc,(Array<Qentem::Tags::TagBit> *)&local_98);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_58.array_,(Array<Qentem::Tags::TagBit> *)&local_98,
             (Value<char16_t> *)&local_78.array_,&local_88);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_98);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[2]>
            (test,&local_88,(char16_t (*) [2])0x13c136,0x81a);
  Value<char16_t>::~Value((Value<char16_t> *)&local_78.array_);
  pcVar2 = local_88.storage_;
  if (local_88.storage_ != (char16_t *)0x0) {
    MemoryRecord::RemoveAllocation(local_88.storage_);
  }
  operator_delete(pcVar2);
  return;
}

Assistant:

static void TestMathUTag1(QTest &test) {
    StringStream<char16_t> ss;
    Value<char16_t>        value;

    value[uR"(a1)"] = 5;
    value[uR"(a2)"] = true;
    value[uR"(a3)"] = nullptr;
    value[uR"(a4)"] = false;
    value[uR"(a5)"] = uR"(10)";
    value[uR"(a6)"] = uR"(20)";
    value[uR"(a7)"] = 6;
    value[uR"(a8)"] = 1;
    value[uR"(a9)"] = uR"(1)";

    test.IsEqual(Template::Render(uR"({math:1+1})", value, ss), uR"(2)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a1}+8})", value, ss), uR"(13)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a7}+8})", value, ss), uR"(14)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a7}+{var:a1}})", value, ss), uR"(11)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a5}+{var:a1}})", value, ss), uR"(15)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a1}+{var:a5}})", value, ss), uR"(15)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a6}+{var:a5}})", value, ss), uR"(30)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a6}*{var:a2}})", value, ss), uR"(20)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a6}*{var:a4}})", value, ss), uR"(0)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a6}*{var:a7}})", value, ss), uR"(120)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a7}+{var:a6}})", value, ss), uR"(26)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a1}+{var:a2}})", value, ss), uR"(6)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a8}=={var:a2}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a2}=={var:a8}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a5}!={var:a1}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a2}!={var:a4}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a2}==true})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a9}=={var:a8}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a8}=={var:a9}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:1=={var:a8}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:6-5==({var:a9})})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:6-5==({var:a8})})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:null!={var:a3}})", value, ss), uR"(0)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:({var:a3})==(0)})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a1}+{var:a7}})", value, ss), uR"(11)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a1}+{var:a7}}{math:{var:a1}+{var:a7}})", value, ss), uR"(1111)",
                 __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a1}+{var:a7}}*{math:{var:a1}+{var:a7}})", value, ss), uR"(11*11)",
                 __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a1}+{var:a7}}##{math:{var:a1}+{var:a7}})", value, ss), uR"(11##11)",
                 __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a1}+{var:a7}}&&&%%^^&&*{math:{var:a1}+{var:a7}})", value, ss),
                 uR"(11&&&%%^^&&*11)", __LINE__);
    ss.Clear();

    ///////////////////

    test.IsEqual(Template::Render(uR"({math: {var:a1}+8})", value, ss), uR"(13)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:  {var:a7}+8})", value, ss), uR"(14)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:     {var:a7}+{var:a1}})", value, ss), uR"(11)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a5} +{var:a1}})", value, ss), uR"(15)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a1}  +{var:a5}})", value, ss), uR"(15)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a6}    +{var:a5}})", value, ss), uR"(30)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a6}* {var:a2}})", value, ss), uR"(20)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a6}*  {var:a4}})", value, ss), uR"(0)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a6}*      {var:a7}})", value, ss), uR"(120)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a7}+{var:a6} })", value, ss), uR"(26)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a1}+{var:a2}  })", value, ss), uR"(6)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a8}=={var:a2}      })", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a2}=={var:a8}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math: {var:a5}!={var:a1} })", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:  {var:a2}!={var:a4}  })", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:    1=={var:a9}     })", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a9} == {var:a8}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a8}  ==  {var:a9}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:1==          {var:a8}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:6-5         ==1})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:1          ==            {var:a8}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:     0     !=    ({var:a3})        })", value, ss), uR"(0)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:a3}       ==       null     })", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:((8+1+{var:a8}))})", value, ss), uR"(10)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:10==(8+1+{var:a8})})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:((8+1+{var:a8}))==9+1})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:(5*2)==((8+1+{var:a8}))})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    //////////////
    value.Reset();

    value += 5;
    value += true;
    value += nullptr;
    value += false;
    value += uR"(10)";
    value += uR"(20)";
    value += 6;
    value += 1;
    value += uR"(1)";
    value += uR"(Qentem)";

    test.IsEqual(Template::Render(uR"({math:{var:0}+8})", value, ss), uR"(13)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:6}+8})", value, ss), uR"(14)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:6}+{var:0}})", value, ss), uR"(11)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:4}+{var:0}})", value, ss), uR"(15)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:0}+{var:4}})", value, ss), uR"(15)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:5}+{var:4}})", value, ss), uR"(30)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:5}*{var:1}})", value, ss), uR"(20)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:5}*{var:3}})", value, ss), uR"(0)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:5}*{var:6}})", value, ss), uR"(120)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:6}+{var:5}})", value, ss), uR"(26)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:0}+{var:1}})", value, ss), uR"(6)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:7}=={var:1}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:1}=={var:7}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:4}!={var:0}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:1}!={var:3}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:({var:1})==({var:8})})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"(-{math:{var:8}=={var:7}})", value, ss), uR"(-1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"(--{math:{var:7}=={var:8}})", value, ss), uR"(--1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"(---{math:1=={var:7}})", value, ss), uR"(---1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:1==({var:8})}-)", value, ss), uR"(1-)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:6-5==({var:7})}--)", value, ss), uR"(1--)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:0==({var:2})}---)", value, ss), uR"(1---)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"(-{math:{var:2}!=null}-)", value, ss), uR"(-0-)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"(--{math:Qente=={var:9}}--)", value, ss), uR"(--0--)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"(---{math:Qente !={var:9}}---)", value, ss), uR"(---1---)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:  Qentem   =={var:9}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:  Qentem!={var:9}})", value, ss), uR"(0)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:9}   ==    Qente})", value, ss), uR"(0)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:{var:9} !=    Qente    })", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math:  {var:9}   ==Qentem})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math: {var:9} !=Qentem})", value, ss), uR"(0)", __LINE__);
    ss.Clear();

    /////////

    test.IsEqual(Template::Render(uR"({math: true == {var:1}})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math: {var:1} == true})", value, ss), uR"(1)", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({math: 8 /2})", value, ss), uR"(4)", __LINE__);
}